

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::CommonFunctionCase::iterate(CommonFunctionCase *this)

{
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols_00;
  int inNdx;
  int iVar1;
  int iVar2;
  long lVar3;
  MessageBuilder *this_00;
  char *description;
  int outNdx_1;
  long lVar4;
  int *value;
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  int local_2b4;
  _Vector_base<void_*,_std::allocator<void_*>_> local_2a0;
  _Vector_base<void_*,_std::allocator<void_*>_> local_288;
  _Vector_base<void_*,_std::allocator<void_*>_> local_270;
  VarValue local_258 [2];
  _Vector_base<void_*,_std::allocator<void_*>_> local_238;
  ostringstream *local_220;
  int *local_218;
  _Vector_base<int,_std::allocator<int>_> local_210;
  _Vector_base<int,_std::allocator<int>_> local_1f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  symbols = &(this->m_spec).inputs;
  iVar1 = computeTotalScalarSize(symbols);
  symbols_00 = &(this->m_spec).outputs;
  iVar2 = computeTotalScalarSize(symbols_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,
             (long)(iVar1 * this->m_numValues),(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,
             (long)(iVar2 * this->m_numValues),(allocator_type *)local_1b0);
  value = &this->m_numValues;
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_270,symbols,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,*value);
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)&local_238,symbols_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,*value);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_numValues,local_270._M_impl.super__Vector_impl_data._M_start)
  ;
  (*this->m_executor->_vptr_ShaderExecutor[5])();
  (*this->m_executor->_vptr_ShaderExecutor[6])
            (this->m_executor,(ulong)(uint)this->m_numValues,
             local_270._M_impl.super__Vector_impl_data._M_start,
             local_238._M_impl.super__Vector_impl_data._M_start);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_1f8,symbols);
  getScalarSizes((vector<int,_std::allocator<int>_> *)&local_210,symbols_00);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_2a0,
             (long)local_270._M_impl.super__Vector_impl_data._M_finish -
             (long)local_270._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_1b0);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_288,
             (long)local_238._M_impl.super__Vector_impl_data._M_finish -
             (long)local_238._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_1b0);
  local_220 = &this->m_failMsg;
  local_2b4 = 0;
  local_218 = value;
  for (iVar1 = 0; iVar1 < *value; iVar1 = iVar1 + 1) {
    for (lVar3 = 0;
        lVar3 < (int)((ulong)((long)local_2a0._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2a0._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar3 = lVar3 + 1) {
      local_2a0._M_impl.super__Vector_impl_data._M_start[lVar3] =
           (void *)((long)(local_1f8._M_impl.super__Vector_impl_data._M_start[lVar3] * iVar1) * 4 +
                   (long)local_270._M_impl.super__Vector_impl_data._M_start[lVar3]);
    }
    lVar3 = 0;
    while( true ) {
      if ((int)((ulong)((long)local_288._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_288._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar3)
      break;
      local_288._M_impl.super__Vector_impl_data._M_start[lVar3] =
           (void *)((long)(local_210._M_impl.super__Vector_impl_data._M_start[lVar3] * iVar1) * 4 +
                   (long)local_238._M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
    }
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,local_2a0._M_impl.super__Vector_impl_data._M_start);
    if ((char)iVar2 == '\0') {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"ERROR: comparison failed for value ");
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar1);
      std::operator<<(&local_1a8,":\n  ");
      std::__cxx11::stringbuf::str();
      std::operator<<(&local_1a8,(string *)local_258);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"  inputs:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      lVar4 = 0;
      for (lVar3 = 0;
          lVar3 < (int)((ulong)((long)local_2a0._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2a0._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar3 = lVar3 + 1) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"    ");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((symbols->
                                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p + lVar4));
        std::operator<<(&local_1a8," = ");
        local_258[0].type =
             (VarType *)
             ((long)&(((symbols->
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar4);
        local_258[0].value = local_2a0._M_impl.super__Vector_impl_data._M_start[lVar3];
        Functional::operator<<(&local_1a8,local_258);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        lVar4 = lVar4 + 0x38;
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"  outputs:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      lVar4 = 0;
      for (lVar3 = 0;
          lVar3 < (int)((ulong)((long)local_288._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_288._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar3 = lVar3 + 1) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"    ");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((symbols_00->
                                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p + lVar4));
        std::operator<<(&local_1a8," = ");
        local_258[0].type =
             (VarType *)
             ((long)&(((symbols_00->
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start)->varType).m_type + lVar4);
        local_258[0].value = local_288._M_impl.super__Vector_impl_data._M_start[lVar3];
        Functional::operator<<(&local_1a8,local_258);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        lVar4 = lVar4 + 0x38;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)local_258);
      std::__cxx11::stringbuf::str
                ((string *)
                 &(this->m_failMsg).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
      value = local_218;
      std::__cxx11::string::~string((string *)local_1b0);
      std::ios::clear((int)(local_220->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3] + (int)local_220);
      local_2b4 = local_2b4 + 1;
    }
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<((ostringstream *)&local_1a8,*value - local_2b4);
  std::operator<<(&local_1a8," / ");
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " values passed");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  description = "Pass";
  if (local_2b4 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(local_2b4 != 0),
             description);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_288);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_2a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_210);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1f8);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_238);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_270);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c8);
  return STOP;
}

Assistant:

CommonFunctionCase::IterateResult CommonFunctionCase::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->useProgram();
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Result comparison failed");
	}

	return STOP;
}